

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

ctmbstr prvTidytidyLocalizedStringN(uint messageType,uint quantity)

{
  ctmbstr local_18;
  ctmbstr result;
  uint quantity_local;
  uint messageType_local;
  
  local_18 = tidyLocalizedStringImpl(messageType,tidyLanguages.currentLanguage,quantity);
  if ((local_18 == (ctmbstr)0x0) && (tidyLanguages.fallbackLanguage != (languageDefinition *)0x0)) {
    local_18 = tidyLocalizedStringImpl(messageType,tidyLanguages.fallbackLanguage,quantity);
  }
  if (local_18 == (ctmbstr)0x0) {
    local_18 = tidyLocalizedStringImpl(messageType,&language_en,quantity);
  }
  if (local_18 == (ctmbstr)0x0) {
    local_18 = tidyLocalizedStringImpl(messageType,&language_en,1);
  }
  return local_18;
}

Assistant:

ctmbstr TY_(tidyLocalizedStringN)( uint messageType, uint quantity )
{
    ctmbstr result;
    
    result  = tidyLocalizedStringImpl( messageType, tidyLanguages.currentLanguage, quantity);
    
    if (!result && tidyLanguages.fallbackLanguage )
    {
        result = tidyLocalizedStringImpl( messageType, tidyLanguages.fallbackLanguage, quantity);
    }
    
    if (!result)
    {
        /* Fallback to en which is built in. */
        result = tidyLocalizedStringImpl( messageType, &language_en, quantity);
    }
    
    if (!result)
    {
        /* Last resort: Fallback to en singular which is built in. */
        result = tidyLocalizedStringImpl( messageType, &language_en, 1);
    }
    
    return result;
}